

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

void cmExpandList(string_view arg,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *argsOut,bool emptyArgs)

{
  bool bVar1;
  size_type sVar2;
  const_iterator __last;
  char *pcVar3;
  ulong uVar4;
  iterator cnext;
  iterator c;
  iterator cend;
  iterator last;
  undefined1 local_48 [4];
  int squareNesting;
  string newArg;
  bool emptyArgs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsOut_local;
  string_view arg_local;
  
  arg_local._M_len = (size_t)arg._M_str;
  argsOut_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)arg._M_len;
  newArg.field_2._M_local_buf[0xf] = emptyArgs;
  if ((emptyArgs) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&argsOut_local), !bVar1
     )) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&argsOut_local,';',0);
    if (sVar2 == 0xffffffffffffffff) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argsOut,
                 (basic_string_view<char,_std::char_traits<char>_> *)&argsOut_local);
    }
    else {
      std::__cxx11::string::string((string *)local_48);
      last._4_4_ = 0;
      cnext = std::basic_string_view<char,_std::char_traits<char>_>::begin
                        ((basic_string_view<char,_std::char_traits<char>_> *)&argsOut_local);
      __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)&argsOut_local);
      cend = cnext;
      for (; cnext != __last; cnext = cnext + 1) {
        switch(*cnext) {
        case ';':
          if (last._4_4_ == 0) {
            std::__cxx11::string::append<char_const*,void>((string *)local_48,cend,cnext);
            cend = cnext + 1;
            uVar4 = std::__cxx11::string::empty();
            if (((uVar4 & 1) == 0) || ((newArg.field_2._M_local_buf[0xf] & 1U) != 0)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(argsOut,(value_type *)local_48);
              std::__cxx11::string::clear();
            }
          }
          break;
        default:
          break;
        case '[':
          last._4_4_ = last._4_4_ + 1;
          break;
        case '\\':
          pcVar3 = cnext + 1;
          if ((pcVar3 != __last) && (*pcVar3 == ';')) {
            std::__cxx11::string::append<char_const*,void>((string *)local_48,cend,cnext);
            cnext = pcVar3;
            cend = pcVar3;
          }
          break;
        case ']':
          last._4_4_ = last._4_4_ + -1;
        }
      }
      std::__cxx11::string::append<char_const*,void>((string *)local_48,cend,__last);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) || ((newArg.field_2._M_local_buf[0xf] & 1U) != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(argsOut,(value_type *)local_48);
      }
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  return;
}

Assistant:

void cmExpandList(cm::string_view arg, std::vector<std::string>& argsOut,
                  bool emptyArgs)
{
  // If argument is empty, it is an empty list.
  if (!emptyArgs && arg.empty()) {
    return;
  }

  // if there are no ; in the name then just copy the current string
  if (arg.find(';') == cm::string_view::npos) {
    argsOut.emplace_back(arg);
    return;
  }

  std::string newArg;
  // Break the string at non-escaped semicolons not nested in [].
  int squareNesting = 0;
  cm::string_view::iterator last = arg.begin();
  cm::string_view::iterator const cend = arg.end();
  for (cm::string_view::iterator c = last; c != cend; ++c) {
    switch (*c) {
      case '\\': {
        // We only want to allow escaping of semicolons.  Other
        // escapes should not be processed here.
        cm::string_view::iterator cnext = c + 1;
        if ((cnext != cend) && *cnext == ';') {
          newArg.append(last, c);
          // Skip over the escape character
          last = cnext;
          c = cnext;
        }
      } break;
      case '[': {
        ++squareNesting;
      } break;
      case ']': {
        --squareNesting;
      } break;
      case ';': {
        // Break the string here if we are not nested inside square
        // brackets.
        if (squareNesting == 0) {
          newArg.append(last, c);
          // Skip over the semicolon
          last = c + 1;
          if (!newArg.empty() || emptyArgs) {
            // Add the last argument if the string is not empty.
            argsOut.push_back(newArg);
            newArg.clear();
          }
        }
      } break;
      default: {
        // Just append this character.
      } break;
    }
  }
  newArg.append(last, cend);
  if (!newArg.empty() || emptyArgs) {
    // Add the last argument if the string is not empty.
    argsOut.push_back(std::move(newArg));
  }
}